

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void __thiscall net_tests::v2transport_test::test_method(v2transport_test *this)

{
  byte *pbVar1;
  pointer *this_00;
  long lVar2;
  pointer pbVar3;
  long lVar4;
  void *pvVar5;
  FastRandomContext *this_01;
  FastRandomContext *this_02;
  undefined1 uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  size_t len;
  uint64_t uVar13;
  CChainParams *pCVar14;
  undefined8 uVar15;
  pointer puVar16;
  byte *pbVar17;
  size_t sVar18;
  pointer pbVar19;
  uchar *puVar20;
  FastRandomContext *rng;
  iterator in_R8;
  pointer puVar21;
  iterator pvVar22;
  iterator in_R9;
  iterator pvVar23;
  check_type cVar24;
  ulong uVar25;
  size_t __n;
  uint i;
  pointer __n_00;
  long in_FS_OFFSET;
  bool bVar26;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  Span<const_unsigned_char> content;
  Span<const_unsigned_char> content_00;
  const_string file_13;
  Span<const_unsigned_char> content_01;
  Span<const_unsigned_char> content_02;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  Span<const_unsigned_char> garbage;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  Span<const_unsigned_char> payload;
  Span<const_unsigned_char> payload_00;
  Span<const_unsigned_char> payload_01;
  Span<const_unsigned_char> payload_02;
  Span<const_unsigned_char> payload_03;
  Span<const_unsigned_char> payload_04;
  Span<const_unsigned_char> payload_05;
  Span<const_unsigned_char> payload_06;
  Span<const_unsigned_char> payload_07;
  Span<const_unsigned_char> payload_08;
  Span<const_unsigned_char> aad;
  Span<const_unsigned_char> aad_00;
  Span<const_unsigned_char> aad_01;
  Span<const_unsigned_char> aad_02;
  Span<const_unsigned_char> aad_03;
  check_type cVar27;
  undefined4 in_stack_ffffffffffffede4;
  char *local_1210;
  char *local_1208;
  undefined1 *local_1200;
  undefined1 *local_11f8;
  char *local_11f0;
  char *local_11e8;
  char *local_11e0;
  char *local_11d8;
  undefined1 *local_11d0;
  undefined1 *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char *local_11b0;
  char *local_11a8;
  undefined1 *local_11a0;
  undefined1 *local_1198;
  char *local_1190;
  char *local_1188;
  char *local_1180;
  char *local_1178;
  undefined1 *local_1170;
  undefined1 *local_1168;
  char *local_1160;
  char *local_1158;
  char *local_1150;
  char *local_1148;
  undefined1 *local_1140;
  undefined1 *local_1138;
  char *local_1130;
  char *local_1128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1120;
  char *local_1108;
  char *local_1100;
  undefined1 *local_10f8;
  undefined1 *local_10f0;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  char *local_10d0;
  undefined1 *local_10c8;
  undefined1 *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  undefined1 *local_1068;
  undefined1 *local_1060;
  char *local_1058;
  char *local_1050;
  char *local_1048;
  char *local_1040;
  undefined1 *local_1038;
  undefined1 *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  undefined1 *local_1008;
  undefined1 *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  undefined1 *local_fd8;
  undefined1 *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  char *local_f58;
  char *local_f50;
  undefined1 *local_f48;
  undefined1 *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  char *local_f08;
  char *local_f00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_ef8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg_data_2_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg_data_1_2;
  char *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  undefined1 *local_e70;
  undefined1 *local_e68;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ver_data;
  undefined1 *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  undefined1 *local_dc8;
  undefined1 *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  undefined1 *local_d68;
  undefined1 *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  undefined1 *local_ba8;
  undefined1 *local_ba0;
  char *local_b98;
  char *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg_data_3_1;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg_data_2;
  char *local_aa8;
  char *local_aa0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg_data_3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a80;
  InteractResult ret;
  string local_a58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg_data_1;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  V2TransportTester tester;
  
  local_1030 = (undefined1 *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  rng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_rng;
  cVar24 = CHECK_PRED;
  do {
    anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,true);
    anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
    local_bd8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_bd0 = "";
    local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x53f;
    file.m_begin = (iterator)&local_bd8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_be8,msg);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (pointer)CONCAT71(ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._9_7_,
                                             ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._8_1_) &
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_engaged);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_bf8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_bf0 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_bf8,0x53f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
               tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
               &tester.m_cipher.m_session_id);
    anon_unknown_17::V2TransportTester::SendGarbage(&tester);
    anon_unknown_17::V2TransportTester::ReceiveKey(&tester);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
               tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_send_garbage_terminator,
               &tester.m_cipher.m_recv_garbage_terminator);
    puVar21 = tester.m_sent_garbage.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)tester.m_sent_garbage.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    puVar16 = tester.m_sent_garbage.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (tester.m_sent_aad != false) {
      puVar21 = (pointer)0x0;
      puVar16 = (uchar *)0x0;
    }
    pvVar22 = (iterator)0x0;
    aad.m_size = (size_t)puVar21;
    aad.m_data = puVar16;
    anon_unknown_17::V2TransportTester::SendPacket
              (&tester,(Span<const_unsigned_char>)ZEXT816(0),aad,false);
    tester.m_sent_aad = true;
    anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                              *)&msg_data_3);
    local_a80._0_1_ = SUB81(&msg_data_2,0);
    if (local_a80._0_1_ == true) {
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&msg_data_3);
    }
    local_c08 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c00 = "";
    local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x546;
    file_00.m_begin = (iterator)&local_c08;
    msg_00.m_end = pvVar22;
    msg_00.m_begin = (iterator)puVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c18,
               msg_00);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (pointer)CONCAT71(ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._9_7_,
                                             ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._8_1_) &
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_engaged);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_c28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c20 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_c28,0x546);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    anon_unknown_17::V2TransportTester::ReceiveGarbage(&tester);
    anon_unknown_17::V2TransportTester::ReceiveVersion(&tester);
    anon_unknown_17::V2TransportTester::CompareSessionIDs(&tester);
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,0x11);
    } while (99999 < uVar10);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_1,&rng->super_RandomMixin<FastRandomContext>,uVar10);
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,10);
    } while (999 < uVar10);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_2,&rng->super_RandomMixin<FastRandomContext>,uVar10);
    payload.m_size =
         (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    payload.m_data =
         msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,'\x04',payload);
    anon_unknown_17::V2TransportTester::SendMessage
              (&tester,'\0',(Span<const_unsigned_char>)ZEXT816(0));
    local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"tx","");
    payload_00.m_size =
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    payload_00.m_data =
         msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,&local_998,payload_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._M_dataplus._M_p != &local_998.field_2) {
      operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
    }
    anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                              *)&msg_data_3);
    local_a80._0_1_ = SUB81(&msg_data_2,0);
    if (local_a80._0_1_ == true) {
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&msg_data_3);
    }
    local_c38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c30 = "";
    local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x550;
    file_01.m_begin = (iterator)&local_c38;
    msg_01.m_end = pvVar23;
    msg_01.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c48,
               msg_01);
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         ret.
         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
         ._M_engaged == true &&
         CONCAT71(ret.
                  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                  ._M_payload._9_7_,
                  ret.
                  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                  ._M_payload._8_1_) -
         ret.
         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
         ._M_payload._0_8_ == 0x108;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->size() == 3";
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_c58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c50 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_c58,0x550);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c60 = "";
    local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x551;
    file_02.m_begin = (iterator)&local_c68;
    msg_02.m_end = pvVar23;
    msg_02.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_c78,
               msg_02);
    if ((((ret.
           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
           ._M_payload._M_value.
           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Optional_base<CNetMessage,_false,_false>)._M_payload.
         super__Optional_payload<CNetMessage,_true,_false,_false>.
         super__Optional_payload_base<CNetMessage>._M_engaged == true) &&
       (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&((ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                         super__Optional_payload<CNetMessage,_true,_false,_false>.
                         super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_type,
                        "cmpctblock"), iVar7 == 0)) {
      pbVar19 = (pointer)(*(long *)&((ret.
                                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                                    super__Optional_payload<CNetMessage,_true,_false,_false>.
                                    super__Optional_payload_base<CNetMessage>._M_payload._M_value.
                                    m_recv.vch +
                         ((ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                         super__Optional_payload<CNetMessage,_true,_false,_false>.
                         super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.
                         m_read_pos);
      pbVar3 = *(pointer *)
                ((long)&((ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                        super__Optional_payload<CNetMessage,_true,_false,_false>.
                        super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.vch + 8
                );
      if ((long)pbVar3 - (long)pbVar19 !=
          (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start) goto LAB_004c4196;
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 1;
      pbVar17 = msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
      for (; pbVar19 != pbVar3; pbVar19 = pbVar19 + 1) {
        if (*pbVar19 != *pbVar17) goto LAB_004c4196;
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
LAB_004c4196:
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0;
    }
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[0] && (*ret)[0]->m_type == \"cmpctblock\" && std::ranges::equal((*ret)[0]->m_recv, MakeByteSpan(msg_data_1))"
    ;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_c88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c80 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_c88,0x551);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_c90 = "";
    local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x552;
    file_03.m_begin = (iterator)&local_c98;
    msg_03.m_end = pvVar23;
    msg_03.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_ca8,
               msg_03);
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         ret.
         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
         ._M_payload._M_value.
         super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
         ._M_impl.super__Vector_impl_data._M_start[1].
         super__Optional_base<CNetMessage,_false,_false>._M_payload.
         super__Optional_payload<CNetMessage,_true,_false,_false>.
         super__Optional_payload_base<CNetMessage>._M_engaged ^ 1;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!(*ret)[1]";
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_cb8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_cb0 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_cb8,0x552);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_cc8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_cc0 = "";
    local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x553;
    file_04.m_begin = (iterator)&local_cc8;
    msg_04.m_end = pvVar23;
    msg_04.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_cd8,
               msg_04);
    if (ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].super__Optional_base<CNetMessage,_false,_false>
        ._M_payload.super__Optional_payload<CNetMessage,_true,_false,_false>.
        super__Optional_payload_base<CNetMessage>._M_engaged == true) {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&ret.
                       super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                       ._M_payload._M_value.
                       super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2].
                       super__Optional_base<CNetMessage,_false,_false>._M_payload.
                       super__Optional_payload<CNetMessage,_true,_false,_false>.
                       super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_type,"tx");
      if (iVar7 == 0) {
        pbVar19 = (pointer)(*(long *)&ret.
                                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2].
                                      super__Optional_base<CNetMessage,_false,_false>._M_payload.
                                      super__Optional_payload<CNetMessage,_true,_false,_false>.
                                      super__Optional_payload_base<CNetMessage>._M_payload._M_value.
                                      m_recv.vch +
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2].
                           super__Optional_base<CNetMessage,_false,_false>._M_payload.
                           super__Optional_payload<CNetMessage,_true,_false,_false>.
                           super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.
                           m_read_pos);
        pbVar3 = *(pointer *)
                  ((long)&ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super__Optional_base<CNetMessage,_false,_false>._M_payload.
                          super__Optional_payload<CNetMessage,_true,_false,_false>.
                          super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.vch +
                  8);
        if ((long)pbVar3 - (long)pbVar19 ==
            (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = 1;
          pbVar17 = msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          for (; pbVar19 != pbVar3; pbVar19 = pbVar19 + 1) {
            if (*pbVar19 != *pbVar17) goto LAB_004c4432;
            pbVar17 = pbVar17 + 1;
          }
          goto LAB_004c4434;
        }
      }
LAB_004c4432:
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0;
    }
    else {
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0;
    }
LAB_004c4434:
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[2] && (*ret)[2]->m_type == \"tx\" && std::ranges::equal((*ret)[2]->m_recv, MakeByteSpan(msg_data_2))"
    ;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_ce8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_ce0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_ce8,0x553);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"bad","");
    payload_01.m_size =
         (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    payload_01.m_data =
         msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,&local_9b8,payload_01);
    this_01 = tester.m_rng;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
      operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
      this_01 = tester.m_rng;
    }
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&this_01->super_RandomMixin<FastRandomContext>,3);
      this_02 = tester.m_rng;
    } while (7 < uVar10);
    puVar21 = tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              ~(ulong)tester.m_to_send.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    if (puVar21 == (pointer)0x0) {
      uVar8 = 0x40;
    }
    else {
      lVar4 = 0x3f;
      if (puVar21 != (pointer)0x0) {
        for (; (ulong)puVar21 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = (uint)lVar4 ^ 0x3f;
    }
    do {
      puVar16 = (pointer)RandomMixin<FastRandomContext>::randbits
                                   (&this_02->super_RandomMixin<FastRandomContext>,0x40 - uVar8);
    } while (puVar21 < puVar16);
    tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[(long)puVar16] =
         tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[(long)puVar16] ^ (byte)(1 << ((byte)uVar10 & 0x1f));
    while( true ) {
      local_a80 = &ver_data;
      anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
      std::
      _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                        *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                *)&msg_data_3);
      if (local_a80._0_1_ == true) {
        std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::
        ~vector((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
                &msg_data_3);
      }
      if (ret.
          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
          ._M_engaged == false) break;
      local_cf8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_cf0 = "";
      local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x55d;
      file_05.m_begin = (iterator)&local_cf8;
      msg_05.m_end = in_R9;
      msg_05.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d08,
                 msg_05);
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ =
           (pointer)CONCAT71(ret.
                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                             ._M_payload._9_7_,
                             ret.
                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                             ._M_payload._8_1_) ==
           ret.
           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
           ._M_payload._M_value.
           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "ret->size() == 0";
      ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "";
      msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "B";
      msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
      local_d18 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_d10 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
                 CONCAT44(in_stack_ffffffffffffede4,cVar24),(size_t)&local_d18,0x55d);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      do {
        uVar10 = RandomMixin<FastRandomContext>::randbits
                           (&rng->super_RandomMixin<FastRandomContext>,0xe);
      } while (9999 < uVar10);
      RandomMixin<FastRandomContext>::randbytes<unsigned_char>
                (&msg_data_3,&rng->super_RandomMixin<FastRandomContext>,uVar10);
      payload_02.m_size =
           CONCAT71(msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish._1_7_,
                    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_1_) -
           (long)msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      payload_02.m_data =
           msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      anon_unknown_17::V2TransportTester::SendMessage(&tester,'\f',payload_02);
      if (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)msg_data_3.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)msg_data_3.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    cVar27 = cVar24;
    if (ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged == true) {
      ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._24_8_ = ret.
                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                ._24_8_ & 0xffffffffffffff00;
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&ret);
    }
    anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
    cVar24 = cVar24 + CHECK_MSG;
  } while (cVar24 != CHECK_SMALL);
  iVar7 = 0;
  do {
    anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,false);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
               tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
               &tester.m_cipher.m_session_id);
    anon_unknown_17::V2TransportTester::SendGarbage(&tester);
    anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
    local_d28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_d20 = "";
    local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x56a;
    file_06.m_begin = (iterator)&local_d28;
    msg_06.m_end = in_R9;
    msg_06.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_d38,
               msg_06);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (pointer)CONCAT71(ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._9_7_,
                                             ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._8_1_) &
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_engaged);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_d48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_d40 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar27),(size_t)&local_d48,0x56a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    anon_unknown_17::V2TransportTester::ReceiveKey(&tester);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
               tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_send_garbage_terminator,
               &tester.m_cipher.m_recv_garbage_terminator);
    puVar21 = tester.m_sent_garbage.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)tester.m_sent_garbage.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    puVar16 = tester.m_sent_garbage.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (tester.m_sent_aad != false) {
      puVar21 = (pointer)0x0;
      puVar16 = (uchar *)0x0;
    }
    pvVar22 = (iterator)0x0;
    aad_00.m_size = (size_t)puVar21;
    aad_00.m_data = puVar16;
    anon_unknown_17::V2TransportTester::SendPacket
              (&tester,(Span<const_unsigned_char>)ZEXT816(0),aad_00,false);
    tester.m_sent_aad = true;
    anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                              *)&msg_data_3);
    local_a80._0_1_ = SUB81(&msg_data_2,0);
    if (local_a80._0_1_ == true) {
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&msg_data_3);
    }
    local_d58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_d50 = "";
    local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x56f;
    file_07.m_begin = (iterator)&local_d58;
    msg_07.m_end = pvVar22;
    msg_07.m_begin = (iterator)puVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_d68,
               msg_07);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (pointer)CONCAT71(ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._9_7_,
                                             ret.
                                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                             ._M_payload._8_1_) &
                           ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_engaged);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_d78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_d70 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar27),(size_t)&local_d78,0x56f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    anon_unknown_17::V2TransportTester::ReceiveGarbage(&tester);
    anon_unknown_17::V2TransportTester::ReceiveVersion(&tester);
    anon_unknown_17::V2TransportTester::CompareSessionIDs(&tester);
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,0x11);
    } while (99999 < uVar10);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_1,&rng->super_RandomMixin<FastRandomContext>,uVar10);
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,10);
    } while (999 < uVar10);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_2,&rng->super_RandomMixin<FastRandomContext>,uVar10);
    payload_03.m_size =
         (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    payload_03.m_data =
         msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,'\x0e',payload_03);
    payload_04.m_size =
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    payload_04.m_data =
         msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,'\x13',payload_04);
    anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                              *)&msg_data_3);
    local_a80._0_1_ = SUB81(&msg_data_2,0);
    if (local_a80._0_1_ == true) {
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&msg_data_3);
    }
    local_d88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_d80 = "";
    local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x578;
    file_08.m_begin = (iterator)&local_d88;
    msg_08.m_end = pvVar23;
    msg_08.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_d98,
               msg_08);
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         ret.
         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
         ._M_engaged == true &&
         CONCAT71(ret.
                  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                  ._M_payload._9_7_,
                  ret.
                  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                  ._M_payload._8_1_) -
         ret.
         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
         ._M_payload._0_8_ == 0xb0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->size() == 2";
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_da8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_da0 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar27),(size_t)&local_da8,0x578);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_db8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_db0 = "";
    local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x579;
    file_09.m_begin = (iterator)&local_db8;
    msg_09.m_end = pvVar23;
    msg_09.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_dc8,
               msg_09);
    if ((((ret.
           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
           ._M_payload._M_value.
           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super__Optional_base<CNetMessage,_false,_false>)._M_payload.
         super__Optional_payload<CNetMessage,_true,_false,_false>.
         super__Optional_payload_base<CNetMessage>._M_engaged == true) &&
       (iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&((ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                         super__Optional_payload<CNetMessage,_true,_false,_false>.
                         super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_type,"inv")
       , iVar9 == 0)) {
      pbVar19 = (pointer)(*(long *)&((ret.
                                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                                    super__Optional_payload<CNetMessage,_true,_false,_false>.
                                    super__Optional_payload_base<CNetMessage>._M_payload._M_value.
                                    m_recv.vch +
                         ((ret.
                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                           ._M_payload._M_value.
                           super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                         super__Optional_payload<CNetMessage,_true,_false,_false>.
                         super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.
                         m_read_pos);
      pbVar3 = *(pointer *)
                ((long)&((ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Optional_base<CNetMessage,_false,_false>)._M_payload.
                        super__Optional_payload<CNetMessage,_true,_false,_false>.
                        super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.vch + 8
                );
      if ((long)pbVar3 - (long)pbVar19 !=
          (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start) goto LAB_004c4e4c;
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 1;
      pbVar17 = msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
      for (; pbVar19 != pbVar3; pbVar19 = pbVar19 + 1) {
        if (*pbVar19 != *pbVar17) goto LAB_004c4e4c;
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
LAB_004c4e4c:
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0;
    }
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[0] && (*ret)[0]->m_type == \"inv\" && std::ranges::equal((*ret)[0]->m_recv, MakeByteSpan(msg_data_1))"
    ;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_dd8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_dd0 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar27),(size_t)&local_dd8,0x579);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_de8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_de0 = "";
    local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x57a;
    file_10.m_begin = (iterator)&local_de8;
    msg_10.m_end = pvVar23;
    msg_10.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_df8,
               msg_10);
    if ((ret.
         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
         ._M_payload._M_value.
         super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
         ._M_impl.super__Vector_impl_data._M_start[1].
         super__Optional_base<CNetMessage,_false,_false>._M_payload.
         super__Optional_payload<CNetMessage,_true,_false,_false>.
         super__Optional_payload_base<CNetMessage>._M_engaged == true) &&
       (iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super__Optional_base<CNetMessage,_false,_false>._M_payload.
                         super__Optional_payload<CNetMessage,_true,_false,_false>.
                         super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_type,"pong"
                       ), iVar9 == 0)) {
      pbVar19 = (pointer)(*(long *)&ret.
                                    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                    ._M_payload._M_value.
                                    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].
                                    super__Optional_base<CNetMessage,_false,_false>._M_payload.
                                    super__Optional_payload<CNetMessage,_true,_false,_false>.
                                    super__Optional_payload_base<CNetMessage>._M_payload._M_value.
                                    m_recv.vch +
                         ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].
                         super__Optional_base<CNetMessage,_false,_false>._M_payload.
                         super__Optional_payload<CNetMessage,_true,_false,_false>.
                         super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.
                         m_read_pos);
      pbVar3 = *(pointer *)
                ((long)&ret.
                        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Optional_base<CNetMessage,_false,_false>._M_payload.
                        super__Optional_payload<CNetMessage,_true,_false,_false>.
                        super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.vch + 8
                );
      if ((long)pbVar3 - (long)pbVar19 !=
          (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start) goto LAB_004c4fd3;
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 1;
      pbVar17 = msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
      for (; pbVar19 != pbVar3; pbVar19 = pbVar19 + 1) {
        if (*pbVar19 != *pbVar17) goto LAB_004c4fd3;
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
LAB_004c4fd3:
      msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0;
    }
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[1] && (*ret)[1]->m_type == \"pong\" && std::ranges::equal((*ret)[1]->m_recv, MakeByteSpan(msg_data_2))"
    ;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_e08 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e00 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar27),(size_t)&local_e08,0x57a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_3_1,&rng->super_RandomMixin<FastRandomContext>,0x3d1c88);
    payload_05.m_size =
         (long)msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)CONCAT71(msg_data_3_1.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start._1_7_,
                        (byte)msg_data_3_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    payload_05.m_data =
         (uchar *)CONCAT71(msg_data_3_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           (byte)msg_data_3_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    anon_unknown_17::V2TransportTester::SendMessage(&tester,'\v',payload_05);
    anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                              *)&msg_data_3);
    local_a80._0_1_ = SUB81(&ver_data,0);
    if (local_a80._0_1_ == true) {
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&msg_data_3);
    }
    local_e18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e10 = "";
    local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x580;
    file_11.m_begin = (iterator)&local_e18;
    msg_11.m_end = pvVar23;
    msg_11.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_e28,
               msg_11);
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(ver_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            ret.
                            super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                            ._M_engaged) ^ 1);
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!ret";
    msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "B";
    msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_a80 = &msg_data_1_2;
    local_e50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e48 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ver_data,(lazy_ostream *)&msg_data_3,1,0,WARN,
               CONCAT44(in_stack_ffffffffffffede4,cVar27),(size_t)&local_e50,0x580);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pvVar5 = (void *)CONCAT71(msg_data_3_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              (byte)msg_data_3_1.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)msg_data_3_1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5
                     );
    }
    if (msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged == true) {
      ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._24_8_ = ret.
                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                ._24_8_ & 0xffffffffffffff00;
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&ret);
    }
    anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 10);
  iVar7 = 0;
  do {
    uVar10 = RandomMixin<FastRandomContext>::randbits<1>(&rng->super_RandomMixin<FastRandomContext>)
    ;
    uVar11 = RandomMixin<FastRandomContext>::randbits<1>(&rng->super_RandomMixin<FastRandomContext>)
    ;
    do {
      uVar12 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,4);
    } while (9 < uVar12);
    sVar18 = 0;
    if (uVar11 == 0) {
      sVar18 = 0xfff;
    }
    uVar11 = RandomMixin<FastRandomContext>::randbits<1>(&rng->super_RandomMixin<FastRandomContext>)
    ;
    len = 0;
    if (uVar11 == 0) {
      do {
        len = RandomMixin<FastRandomContext>::randbits
                        (&rng->super_RandomMixin<FastRandomContext>,10);
      } while (999 < len);
    }
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&ver_data,&rng->super_RandomMixin<FastRandomContext>,len);
    if (uVar10 == 0) {
      cVar27 = CONCAT31((int3)(cVar27 >> 8),1);
    }
    else {
      uVar11 = RandomMixin<FastRandomContext>::randbits<1>
                         (&rng->super_RandomMixin<FastRandomContext>);
      cVar27 = CONCAT31((int3)(cVar27 >> 8),uVar11 != 0);
    }
    do {
      uVar11 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,10);
    } while (999 < uVar11);
    do {
      uVar13 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,10);
    } while (999 < uVar13);
    anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,uVar10 != 0);
    if ((char)cVar27 != '\0') {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
                 tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
                 &tester.m_cipher.m_session_id);
      anon_unknown_17::V2TransportTester::SendGarbage(&tester,sVar18);
    }
    anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
    local_e60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e58 = "";
    local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x597;
    file_12.m_begin = (iterator)&local_e60;
    msg_12.m_end = in_R9;
    msg_12.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_e70,
               msg_12);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_e80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e78 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,2,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_e80,0x597);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    if ((char)cVar27 == '\0') {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
                 tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
                 &tester.m_cipher.m_session_id);
      anon_unknown_17::V2TransportTester::SendGarbage(&tester,sVar18);
    }
    anon_unknown_17::V2TransportTester::ReceiveKey(&tester);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
               tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_send_garbage_terminator,
               &tester.m_cipher.m_recv_garbage_terminator);
    if (uVar12 != 0) {
      iVar9 = 0;
      do {
        uVar10 = RandomMixin<FastRandomContext>::randbits<1>
                           (&rng->super_RandomMixin<FastRandomContext>);
        if (uVar10 == 0) {
          do {
            sVar18 = RandomMixin<FastRandomContext>::randbits
                               (&rng->super_RandomMixin<FastRandomContext>,10);
          } while (999 < sVar18);
        }
        else {
          sVar18 = 0;
        }
        RandomMixin<FastRandomContext>::randbytes<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,
                   &rng->super_RandomMixin<FastRandomContext>,sVar18);
        content.m_size =
             CONCAT71(ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._9_7_,
                      ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._8_1_) -
             ret.
             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
             ._M_payload._0_8_;
        sVar18 = (long)tester.m_sent_garbage.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)tester.m_sent_garbage.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        puVar21 = tester.m_sent_garbage.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (tester.m_sent_aad != false) {
          sVar18 = 0;
          puVar21 = (uchar *)0x0;
        }
        content.m_data =
             (uchar *)ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        aad_01.m_size = sVar18;
        aad_01.m_data = puVar21;
        anon_unknown_17::V2TransportTester::SendPacket(&tester,content,aad_01,true);
        tester.m_sent_aad = true;
        if (ret.
            super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)ret.
                                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._0_8_);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != (int)uVar12 + (uint)((int)uVar12 == 0));
    }
    content_00.m_size =
         (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar21 = tester.m_sent_garbage.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              -(long)tester.m_sent_garbage.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    puVar16 = tester.m_sent_garbage.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (tester.m_sent_aad != false) {
      puVar21 = (pointer)0x0;
      puVar16 = (uchar *)0x0;
    }
    pvVar22 = (iterator)0x0;
    content_00.m_data =
         ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_02.m_size = (size_t)puVar21;
    aad_02.m_data = puVar16;
    anon_unknown_17::V2TransportTester::SendPacket(&tester,content_00,aad_02,false);
    tester.m_sent_aad = true;
    anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&msg_data_3,
                     (_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret);
    if (ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged == true) {
      ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._24_8_ = ret.
                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                ._24_8_ & 0xffffffffffffff00;
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&ret);
    }
    local_e90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_e88 = "";
    local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x5a5;
    file_13.m_begin = (iterator)&local_e90;
    msg_13.m_end = pvVar22;
    msg_13.m_begin = (iterator)puVar21;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_ea0,
               msg_13);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_eb0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_ea8 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,2,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_eb0,0x5a5);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    anon_unknown_17::V2TransportTester::ReceiveGarbage(&tester);
    anon_unknown_17::V2TransportTester::ReceiveVersion(&tester);
    anon_unknown_17::V2TransportTester::CompareSessionIDs(&tester);
    if (uVar11 != 0) {
      iVar9 = 0;
      do {
        do {
          uVar10 = RandomMixin<FastRandomContext>::randbits
                             (&rng->super_RandomMixin<FastRandomContext>,10);
        } while (999 < uVar10);
        RandomMixin<FastRandomContext>::randbytes<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,
                   &rng->super_RandomMixin<FastRandomContext>,uVar10);
        content_01.m_size =
             CONCAT71(ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._9_7_,
                      ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._8_1_) -
             ret.
             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
             ._M_payload._0_8_;
        pvVar22 = (iterator)0x0;
        pvVar23 = (iterator)0x1;
        content_01.m_data =
             (uchar *)ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        anon_unknown_17::V2TransportTester::SendPacket
                  (&tester,content_01,(Span<const_unsigned_char>)ZEXT816(0),true);
        if (ret.
            super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)ret.
                                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._0_8_);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != (int)uVar11 + (uint)((int)uVar11 == 0));
    }
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,0x16);
    } while (3999999 < uVar10);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_1_2,&rng->super_RandomMixin<FastRandomContext>,uVar10);
    payload_06.m_size =
         (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    payload_06.m_data =
         msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,'\x1c',payload_06);
    if (uVar13 != 0) {
      iVar9 = 0;
      do {
        do {
          uVar10 = RandomMixin<FastRandomContext>::randbits
                             (&rng->super_RandomMixin<FastRandomContext>,10);
        } while (999 < uVar10);
        RandomMixin<FastRandomContext>::randbytes<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,
                   &rng->super_RandomMixin<FastRandomContext>,uVar10);
        content_02.m_size =
             CONCAT71(ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._9_7_,
                      ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._8_1_) -
             ret.
             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
             ._M_payload._0_8_;
        pvVar22 = (iterator)0x0;
        pvVar23 = (iterator)0x1;
        content_02.m_data =
             (uchar *)ret.
                      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        anon_unknown_17::V2TransportTester::SendPacket
                  (&tester,content_02,(Span<const_unsigned_char>)ZEXT816(0),true);
        if (ret.
            super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)ret.
                                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_payload._0_8_);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != (int)uVar13 + (uint)((int)uVar13 == 0));
    }
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,10);
    } while (999 < uVar10);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&msg_data_2_2,&rng->super_RandomMixin<FastRandomContext>,uVar10);
    payload_07.m_size =
         (long)msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    payload_07.m_data =
         msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    anon_unknown_17::V2TransportTester::SendMessage(&tester,'\r',payload_07);
    local_9d8.field_2._M_allocated_capacity = 0x6e78746b636f6c62;
    local_9d8.field_2._8_4_ = 0xa0000;
    local_9d8._M_string_length = 0xc;
    local_9d8.field_2._M_local_buf[0xc] = '\0';
    local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
    anon_unknown_17::V2TransportTester::SendMessage
              (&tester,&local_9d8,(Span<const_unsigned_char>)ZEXT816(0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
      operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
    }
    local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"foobar","");
    anon_unknown_17::V2TransportTester::SendMessage
              (&tester,&local_9f8,(Span<const_unsigned_char>)ZEXT816(0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
      operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
    }
    local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"barfoo","");
    local_ef8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_ef8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ef8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    anon_unknown_17::V2TransportTester::AddMessage(&tester,&local_a18,&local_ef8);
    if (local_ef8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_ef8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_ef8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_ef8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
      operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
    }
    anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
    std::
    _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&msg_data_3,
                     (_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                      *)&ret);
    if (ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged == true) {
      ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._24_8_ = ret.
                super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                ._24_8_ & 0xffffffffffffff00;
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&ret);
    }
    local_f08 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f00 = "";
    local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x5ba;
    file_14.m_begin = (iterator)&local_f08;
    msg_14.m_end = pvVar23;
    msg_14.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_f18,
               msg_14);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           local_a80._0_1_ == true &&
                           CONCAT71(msg_data_3.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                    msg_data_3.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
                           (long)msg_data_3.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start == 0x160);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "ret && ret->size() == 4";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_f28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f20 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,2,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_f28,0x5ba);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    local_f38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f30 = "";
    local_f48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x5bb;
    file_15.m_begin = (iterator)&local_f38;
    msg_15.m_end = pvVar23;
    msg_15.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_f48,
               msg_15);
    if (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[0x50] == '\x01') {
      iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x30),"addrv2");
      if (iVar9 == 0) {
        puVar20 = (uchar *)(*(long *)msg_data_3.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                           *(long *)(msg_data_3.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x18));
        if ((long)*(uchar **)
                   (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8) - (long)puVar20 ==
            (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 1;
          puVar21 = msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          for (; puVar20 !=
                 *(uchar **)
                  (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 8); puVar20 = puVar20 + 1) {
            if (*puVar20 != *puVar21) goto LAB_004c5d65;
            puVar21 = puVar21 + 1;
          }
          goto LAB_004c5d67;
        }
      }
LAB_004c5d65:
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
    }
LAB_004c5d67:
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,uVar6);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[0] && (*ret)[0]->m_type == \"addrv2\" && std::ranges::equal((*ret)[0]->m_recv, MakeByteSpan(msg_data_1))"
    ;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_f58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f50 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_f58,0x5bb);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    local_f68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f60 = "";
    local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x5bc;
    file_16.m_begin = (iterator)&local_f68;
    msg_16.m_end = pvVar23;
    msg_16.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_f78,
               msg_16);
    if (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[0xa8] == '\x01') {
      iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x88),"headers");
      if (iVar9 == 0) {
        puVar20 = (uchar *)(*(long *)(msg_data_3.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x58) +
                           *(long *)(msg_data_3.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x70));
        if ((long)*(uchar **)
                   (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x60) - (long)puVar20 ==
            (long)msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          uVar6 = 1;
          puVar21 = msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          for (; puVar20 !=
                 *(uchar **)
                  (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x60); puVar20 = puVar20 + 1) {
            if (*puVar20 != *puVar21) goto LAB_004c5ee2;
            puVar21 = puVar21 + 1;
          }
          goto LAB_004c5ee4;
        }
      }
LAB_004c5ee2:
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
    }
LAB_004c5ee4:
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,uVar6);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[1] && (*ret)[1]->m_type == \"headers\" && std::ranges::equal((*ret)[1]->m_recv, MakeByteSpan(msg_data_2))"
    ;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_f88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f80 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_f88,0x5bc);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    local_f98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_f90 = "";
    local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x5bd;
    file_17.m_begin = (iterator)&local_f98;
    msg_17.m_end = pvVar23;
    msg_17.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_fa8,
               msg_17);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(msg_data_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            msg_data_3.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[0x100]) ^ 1);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!(*ret)[2]";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_fb8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_fb0 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_fb8,0x5bd);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    local_fc8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_fc0 = "";
    local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_18.m_end = (iterator)0x5be;
    file_18.m_begin = (iterator)&local_fc8;
    msg_18.m_end = pvVar23;
    msg_18.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_fd8,
               msg_18);
    if ((msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[0x158] == '\x01') &&
       (iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (msg_data_3.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x138),"foobar"), iVar9 == 0)) {
      bVar26 = *(long *)(msg_data_3.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x110) -
               *(long *)(msg_data_3.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x108) ==
               *(long *)(msg_data_3.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 0x120);
    }
    else {
      bVar26 = false;
    }
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(msg_data_1.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,bVar26);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "(*ret)[3] && (*ret)[3]->m_type == \"foobar\" && (*ret)[3]->m_recv.empty()";
    msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &msg_data_2;
    local_fe8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_fe0 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar7,cVar27),
               (size_t)&local_fe8,0x5be);
    this_00 = &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    boost::detail::shared_count::~shared_count((shared_count *)this_00);
    msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg_data_1,"barfoo","");
    anon_unknown_17::V2TransportTester::ReceivePacket
              (&msg_data_2,&tester,(Span<const_std::byte>)ZEXT816(0));
    local_aa8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_aa0 = "";
    local_ad0 = "";
    local_ac8 = "";
    file_19.m_end = (iterator)0x504;
    file_19.m_begin = (iterator)&local_aa8;
    msg_19.m_end = pvVar23;
    msg_19.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_ad0,
               msg_19);
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start == 0xd;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_ae0 = "ret.size() == payload.size() + 1 + CMessageHeader::COMMAND_SIZE";
    local_ad8 = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    local_af0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_ae8 = "";
    pvVar22 = (iterator)0x2;
    pvVar23 = (iterator)0x0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &local_ae0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&ret,2,0,WARN,
               CONCAT44(iVar7,cVar27),(size_t)&local_af0,0x504);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_ae0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_ad8 = "";
    local_b00 = "";
    local_af8 = "";
    file_20.m_end = (iterator)0x505;
    file_20.m_begin = (iterator)&local_ae0;
    msg_20.m_end = pvVar23;
    msg_20.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_b00,
               msg_20);
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         *msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == '\0';
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b10 = "ret[0] == 0";
    local_b08 = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &local_b10;
    local_b20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_b18 = "";
    pvVar22 = (iterator)0x1;
    pvVar23 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&ret,1,0,WARN,
               CONCAT44(iVar7,cVar27),(size_t)&local_b20,0x505);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    puVar21 = (pointer)0x0;
    do {
      if (puVar21 < msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        local_b10 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_b08 = "";
        local_b30 = "";
        local_b28 = "";
        file_21.m_end = (iterator)0x508;
        file_21.m_begin = (iterator)&local_b10;
        msg_21.m_end = pvVar23;
        msg_21.m_begin = pvVar22;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_b30
                   ,msg_21);
        msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             (uint)(msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1)[(long)puVar21] ==
             (int)(char)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)puVar21];
        msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b40 = "ret[1 + i] == m_type[i]";
        local_b38 = "";
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._8_1_ = 0;
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)boost::unit_test::lazy_ostream::inst;
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._24_8_ = &local_b40;
        local_b68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_b60 = "";
        pvVar22 = (iterator)0x1;
        pvVar23 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&ret,1,0,WARN,
                   CONCAT44(iVar7,cVar27),(size_t)&local_b68,0x508);
      }
      else {
        local_b78 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_b70 = "";
        local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
        local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
        file_22.m_end = (iterator)0x50a;
        file_22.m_begin = (iterator)&local_b78;
        msg_22.m_end = pvVar23;
        msg_22.m_begin = pvVar22;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_b88
                   ,msg_22);
        msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             (msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 1)[(long)puVar21] == '\0';
        msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b40 = "ret[1 + i] == 0";
        local_b38 = "";
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._8_1_ = 0;
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)boost::unit_test::lazy_ostream::inst;
        ret.
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._24_8_ = &local_b40;
        local_b98 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_b90 = "";
        pvVar22 = (iterator)0x1;
        pvVar23 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&ret,1,0,WARN,
                   CONCAT44(iVar7,cVar27),(size_t)&local_b98,0x50a);
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      puVar21 = puVar21 + 1;
    } while (puVar21 != (pointer)0xc);
    local_b40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_b38 = "";
    local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_23.m_end = (iterator)0x50d;
    file_23.m_begin = (iterator)&local_b40;
    msg_23.m_end = pvVar23;
    msg_23.m_begin = pvVar22;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_ba8,
               msg_23);
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start == 0xd;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bb8 = "std::ranges::equal(Span{ret}.subspan(1 + CMessageHeader::COMMAND_SIZE), payload)";
    local_bb0 = "";
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._8_1_ = 0;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._M_payload._M_value.
    super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = &local_bb8;
    local_bc8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_bc0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&msg_data_3_1,(lazy_ostream *)&ret,1,0,WARN,
               CONCAT44(iVar7,cVar27),(size_t)&local_bc8,0x50d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)(msg_data_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    }
    if (msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_2_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_2_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)msg_data_1_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)msg_data_1_2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a80._0_1_ == true) {
      local_a80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
      std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
                ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *
                 )&msg_data_3);
    }
    anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
    iVar9 = iVar7;
    if (ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)ver_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)ver_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x32);
  anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,true);
  anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
  local_ff8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_ff0 = "";
  local_1008 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x5c6;
  file_24.m_begin = (iterator)&local_ff8;
  msg_24.m_end = in_R9;
  msg_24.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_1008,
             msg_24);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         (pointer)CONCAT71(ret.
                                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                           ._M_payload._9_7_,
                                           ret.
                                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                           ._M_payload._8_1_) &
                         ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_engaged);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ret && ret->empty()";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_1018 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1010 = "";
  pvVar22 = (iterator)0x2;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
             CONCAT44(iVar9,cVar27),(size_t)&local_1018,0x5c6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
             tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
             &tester.m_cipher.m_session_id);
  anon_unknown_17::V2TransportTester::SendGarbage(&tester,0x1000);
  anon_unknown_17::V2TransportTester::ReceiveKey(&tester);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
             tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_send_garbage_terminator,
             &tester.m_cipher.m_recv_garbage_terminator);
  anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
  std::
  _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                            *)&msg_data_3);
  local_a80._0_1_ = SUB81(&msg_data_2,0);
  if (local_a80._0_1_ == true) {
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &msg_data_3);
  }
  local_1028 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1020 = "";
  local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x5cc;
  file_25.m_begin = (iterator)&local_1028;
  msg_25.m_end = pvVar23;
  msg_25.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_1038,
             msg_25);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_engaged) ^ 1);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!ret";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_1048 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1040 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
             CONCAT44(iVar9,cVar27),(size_t)&local_1048,0x5cc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged == true) {
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = ret.
              super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &ret);
  }
  anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
  anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,false);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
             tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
             &tester.m_cipher.m_session_id);
  anon_unknown_17::V2TransportTester::SendGarbage(&tester,0x1000);
  anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
  local_1058 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1050 = "";
  local_1068 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x5d5;
  file_26.m_begin = (iterator)&local_1058;
  msg_26.m_end = pvVar23;
  msg_26.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_1068,
             msg_26);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_payload._M_value.
                         super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         (pointer)CONCAT71(ret.
                                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                           ._M_payload._9_7_,
                                           ret.
                                           super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                                           ._M_payload._8_1_) &
                         ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_engaged);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ret && ret->empty()";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_1078 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1070 = "";
  pvVar22 = (iterator)0x2;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,2,0,WARN,
             CONCAT44(iVar9,cVar27),(size_t)&local_1078,0x5d5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown_17::V2TransportTester::ReceiveKey(&tester);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
             tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_send_garbage_terminator,
             &tester.m_cipher.m_recv_garbage_terminator);
  anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
  std::
  _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    *)&ret,(_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                            *)&msg_data_3);
  local_a80._0_1_ = SUB81(&msg_data_2,0);
  if (local_a80._0_1_ == true) {
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &msg_data_3);
  }
  local_1088 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1080 = "";
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x5d9;
  file_27.m_begin = (iterator)&local_1088;
  msg_27.m_end = pvVar23;
  msg_27.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1098,
             msg_27);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_engaged) ^ 1);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!ret";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_10a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_10a0 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
             CONCAT44(iVar9,cVar27),(size_t)&local_10a8,0x5d9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged == true) {
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = ret.
              super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &ret);
  }
  anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
  anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,true);
  anon_unknown_17::V2TransportTester::Interact((InteractResult *)&msg_data_3,&tester);
  local_10b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_10b0 = "";
  local_10c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x5e0;
  file_28.m_begin = (iterator)&local_10b8;
  msg_28.m_end = pvVar23;
  msg_28.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_10c8,
             msg_28);
  local_a80._0_1_ = SUB81(&msg_data_2,0);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ret && ret->empty()";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &msg_data_2;
  local_10d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_10d0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,2,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_10d8,0x5e0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
             tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_our_pubkey,
             &tester.m_cipher.m_session_id);
  anon_unknown_17::V2TransportTester::ReceiveKey(&tester);
  do {
    uVar10 = RandomMixin<FastRandomContext>::randbits
                       (&rng->super_RandomMixin<FastRandomContext>,0xc);
  } while (0xfef < uVar10);
  uVar25 = 0xfef - uVar10;
  if (uVar25 == 0) {
    uVar8 = 0x40;
  }
  else {
    lVar4 = 0x3f;
    if (uVar25 != 0) {
      for (; uVar25 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    uVar8 = (uint)lVar4 ^ 0x3f;
  }
  do {
    uVar11 = RandomMixin<FastRandomContext>::randbits
                       (&rng->super_RandomMixin<FastRandomContext>,0x40 - uVar8);
  } while (uVar25 < uVar11);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            (&msg_data_3_1,&rng->super_RandomMixin<FastRandomContext>,uVar10 + uVar11 + 0x10);
  pbVar17 = (byte *)(CONCAT71(msg_data_3_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              (byte)msg_data_3_1.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + uVar10);
  *(undefined8 *)pbVar17 = tester.m_cipher.m_send_garbage_terminator._M_elems._0_8_;
  *(undefined8 *)(pbVar17 + 8) = tester.m_cipher.m_send_garbage_terminator._M_elems._8_8_;
  do {
    uVar11 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3);
  } while (7 < uVar11);
  pbVar1 = (byte *)(CONCAT71(msg_data_3_1.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             (byte)msg_data_3_1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 0xf + uVar10);
  *pbVar1 = *pbVar1 ^ (byte)(1 << ((byte)uVar11 & 0x1f));
  garbage.m_size =
       (long)msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)CONCAT71(msg_data_3_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      (byte)msg_data_3_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  garbage.m_data =
       (uchar *)CONCAT71(msg_data_3_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (byte)msg_data_3_1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  anon_unknown_17::V2TransportTester::SendGarbage(&tester,garbage);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&tester.m_to_send,
             tester.m_to_send.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,&tester.m_cipher.m_send_garbage_terminator);
  puVar20 = tester.m_sent_garbage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish +
            -(long)tester.m_sent_garbage.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (tester.m_sent_aad != false) {
    tester.m_sent_garbage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    puVar20 = (uchar *)0x0;
  }
  pvVar22 = (iterator)0x0;
  aad_03.m_size = (size_t)puVar20;
  aad_03.m_data =
       tester.m_sent_garbage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  anon_unknown_17::V2TransportTester::SendPacket
            (&tester,(Span<const_unsigned_char>)ZEXT816(0),aad_03,false);
  tester.m_sent_aad = true;
  anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
  std::
  _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    *)&msg_data_3,
                   (_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    *)&ret);
  if (ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged == true) {
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = ret.
              super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &ret);
  }
  local_10e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_10e0 = "";
  local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x5f3;
  file_29.m_begin = (iterator)&local_10e8;
  msg_29.m_end = pvVar22;
  msg_29.m_begin = (iterator)puVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_10f8,
             msg_29);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ret && ret->empty()";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &msg_data_2;
  local_1108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1100 = "";
  pvVar22 = (iterator)0x2;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,2,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_1108,0x5f3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown_17::V2TransportTester::ReceiveGarbage(&tester);
  anon_unknown_17::V2TransportTester::ReceiveVersion(&tester);
  anon_unknown_17::V2TransportTester::CompareSessionIDs(&tester);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            (&ver_data,&rng->super_RandomMixin<FastRandomContext>,4000000);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            (&msg_data_1_2,&rng->super_RandomMixin<FastRandomContext>,4000000);
  do {
    uVar10 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,8);
  } while (0xde < uVar10);
  anon_unknown_17::V2TransportTester::SendMessage
            (&tester,(char)uVar10 + '!',(Span<const_unsigned_char>)ZEXT816(0));
  payload_08.m_size =
       (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  payload_08.m_data =
       ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  anon_unknown_17::V2TransportTester::SendMessage(&tester,'\x02',payload_08);
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"blocktxn","");
  uVar25 = (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar25 == 0) {
    local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar25 < 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        uVar15 = std::__throw_bad_alloc();
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (ret.
            super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
            ._M_engaged == true) {
          ret.
          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
          ._24_8_ = ret.
                    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    ._24_8_ & 0xffffffffffffff00;
          std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::
          ~vector((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                   *)&ret);
        }
        anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          _Unwind_Resume(uVar15);
        }
      }
      goto LAB_004c841b;
    }
    local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)operator_new(uVar25);
    __n = (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  }
  local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish + uVar25;
  local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    memmove(local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish,
            msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,__n);
  }
  local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish + __n;
  anon_unknown_17::V2TransportTester::AddMessage(&tester,&local_a58,&local_1120);
  if (local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1120.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1120.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
  std::
  _Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ::_M_move_assign((_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    *)&msg_data_3,
                   (_Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                    *)&ret);
  if (ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged == true) {
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = ret.
              super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &ret);
  }
  local_1130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1128 = "";
  local_1140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x5fd;
  file_30.m_begin = (iterator)&local_1130;
  msg_30.m_end = pvVar23;
  msg_30.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_1140,
             msg_30);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         local_a80._0_1_ == true &&
                         CONCAT71(msg_data_3.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  msg_data_3.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_1_) -
                         (long)msg_data_3.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start == 0xb0);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ret && ret->size() == 2";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &msg_data_2;
  local_1150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1148 = "";
  pvVar22 = (iterator)0x2;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,2,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_1150,0x5fd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1158 = "";
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x5fe;
  file_31.m_begin = (iterator)&local_1160;
  msg_31.m_end = pvVar23;
  msg_31.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_1170,
             msg_31);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          msg_data_3.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[0x50]) ^ 1);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!(*ret)[0]";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &msg_data_2;
  local_1180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1178 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_1180,0x5fe);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1188 = "";
  local_11a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x5ff;
  file_32.m_begin = (iterator)&local_1190;
  msg_32.m_end = pvVar23;
  msg_32.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_11a0,
             msg_32);
  if (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0xa8] == '\x01') {
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x88),"block");
    if (iVar7 == 0) {
      puVar20 = (uchar *)(*(long *)(msg_data_3.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 0x58) +
                         *(long *)(msg_data_3.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x70));
      if ((long)*(uchar **)
                 (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x60) - (long)puVar20 ==
          (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
        uVar6 = 1;
        puVar21 = ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
        for (; puVar20 !=
               *(uchar **)
                (msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + 0x60); puVar20 = puVar20 + 1) {
          if (*puVar20 != *puVar21) goto LAB_004c75b2;
          puVar21 = puVar21 + 1;
        }
        goto LAB_004c75b4;
      }
    }
LAB_004c75b2:
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
  }
LAB_004c75b4:
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,uVar6);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "(*ret)[1] && (*ret)[1]->m_type == \"block\" && std::ranges::equal((*ret)[1]->m_recv, MakeByteSpan(msg_data_1))"
  ;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &msg_data_2;
  local_11b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_11a8 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_11b0,0x5ff);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar16 = msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar21 = msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  anon_unknown_17::V2TransportTester::ReceivePacket
            (&msg_data_1,&tester,(Span<const_std::byte>)ZEXT816(0));
  msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
  ;
  msg_data_2_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_aa8 = "";
  local_aa0 = "";
  file_33.m_end = (iterator)0x4fa;
  file_33.m_begin = (iterator)&msg_data_2_2;
  msg_33.m_end = pvVar23;
  msg_33.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_aa8,
             msg_33);
  __n_00 = puVar16 + -(long)puVar21;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_2.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         msg_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         -(long)msg_data_1.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start == __n_00 + 1);
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad0 = "ret.size() == payload.size() + 1";
  local_ac8 = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &local_ad0;
  local_ae0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_ad8 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_2,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_ae0,0x4fa);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_ad0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_ac8 = "";
  local_af0 = "";
  local_ae8 = "";
  file_34.m_end = (iterator)0x4fb;
  file_34.m_begin = (iterator)&local_ad0;
  msg_34.m_end = pvVar23;
  msg_34.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_af0,
             msg_34);
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_2.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         *msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start == '\x03');
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b00 = "ret[0] == short_id";
  local_af8 = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &local_b00;
  local_b10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_b08 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_2,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_b10,0x4fb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_b00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_af8 = "";
  local_b20 = "";
  local_b18 = "";
  file_35.m_end = (iterator)0x4fc;
  file_35.m_begin = (iterator)&local_b00;
  msg_35.m_end = pvVar23;
  msg_35.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_b20,
             msg_35);
  if (msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      ~(ulong)msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == __n_00) {
    if (puVar16 == puVar21) {
      bVar26 = true;
    }
    else {
      iVar7 = bcmp(msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1,puVar21,(size_t)__n_00);
      bVar26 = iVar7 == 0;
    }
  }
  else {
    bVar26 = false;
  }
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_2.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar26);
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b30 = "std::ranges::equal(Span{ret}.subspan(1), payload)";
  local_b28 = "";
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._8_1_ = 0;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._M_payload._M_value.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  ret.
  super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  ._24_8_ = &local_b30;
  local_b40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_b38 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_2,(lazy_ostream *)&ret,1,0,WARN,CONCAT44(iVar9,cVar27),
             (size_t)&local_b40,0x4fc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(msg_data_1_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)msg_data_1_2.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)msg_data_1_2.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ver_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar5 = (void *)CONCAT71(msg_data_3_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            (byte)msg_data_3_1.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)msg_data_3_1.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  if (local_a80._0_1_ == true) {
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &msg_data_3);
  }
  anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
  anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,false);
  pCVar14 = Params();
  anon_unknown_17::V2TransportTester::SendV1Version(&tester,&pCVar14->pchMessageStart);
  anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
  local_11c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_11b8 = "";
  local_11d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x608;
  file_36.m_begin = (iterator)&local_11c0;
  msg_36.m_end = pvVar23;
  msg_36.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_11d0,
             msg_36);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(msg_data_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         ret.
                         super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                         ._M_engaged);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "ret";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_11e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_11d8 = "";
  pvVar22 = (iterator)0x1;
  pvVar23 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
             CONCAT44(iVar9,cVar27),(size_t)&local_11e0,0x608);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged == true) {
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = ret.
              super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &ret);
  }
  anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
  anon_unknown_17::V2TransportTester::V2TransportTester(&tester,rng,false);
  CChainParams::Main();
  anon_unknown_17::V2TransportTester::SendV1Version
            (&tester,(MessageStartChars *)
                     ((long)&ret.
                             super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                             ._M_payload._M_value.
                             super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].
                             super__Optional_base<CNetMessage,_false,_false>._M_payload.
                             super__Optional_payload<CNetMessage,_true,_false,_false>.
                             super__Optional_payload_base<CNetMessage>._M_payload._M_value.m_recv.
                             vch + 0x10));
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)&ret);
  anon_unknown_17::V2TransportTester::Interact(&ret,&tester);
  local_11f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_11e8 = "";
  local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x610;
  file_37.m_begin = (iterator)&local_11f0;
  msg_37.m_end = pvVar23;
  msg_37.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1200,
             msg_37);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(CONCAT71(msg_data_1.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_7_,
                          ret.
                          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                          ._M_engaged) ^ 1);
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "!ret";
  msg_data_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "B";
  msg_data_3.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_1210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_1208 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&msg_data_1,(lazy_ostream *)&msg_data_3,1,0,WARN,
             CONCAT44(iVar9,cVar27),(size_t)&local_1210,0x610);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &msg_data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (ret.
      super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
      ._M_engaged == true) {
    ret.
    super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
    ._24_8_ = ret.
              super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              ._24_8_ & 0xffffffffffffff00;
    std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
              ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
               &ret);
  }
  anon_unknown_17::V2TransportTester::~V2TransportTester(&tester);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_004c841b:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(v2transport_test)
{
    // A mostly normal scenario, testing a transport in initiator mode.
    for (int i = 0; i < 10; ++i) {
        V2TransportTester tester(m_rng, true);
        auto ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.SendKey();
        tester.SendGarbage();
        tester.ReceiveKey();
        tester.SendGarbageTerm();
        tester.SendVersion();
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.ReceiveGarbage();
        tester.ReceiveVersion();
        tester.CompareSessionIDs();
        auto msg_data_1 = m_rng.randbytes<uint8_t>(m_rng.randrange(100000));
        auto msg_data_2 = m_rng.randbytes<uint8_t>(m_rng.randrange(1000));
        tester.SendMessage(uint8_t(4), msg_data_1); // cmpctblock short id
        tester.SendMessage(0, {}); // Invalidly encoded message
        tester.SendMessage("tx", msg_data_2); // 12-character encoded message type
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->size() == 3);
        BOOST_CHECK((*ret)[0] && (*ret)[0]->m_type == "cmpctblock" && std::ranges::equal((*ret)[0]->m_recv, MakeByteSpan(msg_data_1)));
        BOOST_CHECK(!(*ret)[1]);
        BOOST_CHECK((*ret)[2] && (*ret)[2]->m_type == "tx" && std::ranges::equal((*ret)[2]->m_recv, MakeByteSpan(msg_data_2)));

        // Then send a message with a bit error, expecting failure. It's possible this failure does
        // not occur immediately (when the length descriptor was modified), but it should come
        // eventually, and no messages can be delivered anymore.
        tester.SendMessage("bad", msg_data_1);
        tester.Damage();
        while (true) {
            ret = tester.Interact();
            if (!ret) break; // failure
            BOOST_CHECK(ret->size() == 0); // no message can be delivered
            // Send another message.
            auto msg_data_3 = m_rng.randbytes<uint8_t>(m_rng.randrange(10000));
            tester.SendMessage(uint8_t(12), msg_data_3); // getheaders short id
        }
    }

    // Normal scenario, with a transport in responder node.
    for (int i = 0; i < 10; ++i) {
        V2TransportTester tester(m_rng, false);
        tester.SendKey();
        tester.SendGarbage();
        auto ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.ReceiveKey();
        tester.SendGarbageTerm();
        tester.SendVersion();
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.ReceiveGarbage();
        tester.ReceiveVersion();
        tester.CompareSessionIDs();
        auto msg_data_1 = m_rng.randbytes<uint8_t>(m_rng.randrange(100000));
        auto msg_data_2 = m_rng.randbytes<uint8_t>(m_rng.randrange(1000));
        tester.SendMessage(uint8_t(14), msg_data_1); // inv short id
        tester.SendMessage(uint8_t(19), msg_data_2); // pong short id
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->size() == 2);
        BOOST_CHECK((*ret)[0] && (*ret)[0]->m_type == "inv" && std::ranges::equal((*ret)[0]->m_recv, MakeByteSpan(msg_data_1)));
        BOOST_CHECK((*ret)[1] && (*ret)[1]->m_type == "pong" && std::ranges::equal((*ret)[1]->m_recv, MakeByteSpan(msg_data_2)));

        // Then send a too-large message.
        auto msg_data_3 = m_rng.randbytes<uint8_t>(4005000);
        tester.SendMessage(uint8_t(11), msg_data_3); // getdata short id
        ret = tester.Interact();
        BOOST_CHECK(!ret);
    }

    // Various valid but unusual scenarios.
    for (int i = 0; i < 50; ++i) {
        /** Whether an initiator or responder is being tested. */
        bool initiator = m_rng.randbool();
        /** Use either 0 bytes or the maximum possible (4095 bytes) garbage length. */
        size_t garb_len = m_rng.randbool() ? 0 : V2Transport::MAX_GARBAGE_LEN;
        /** How many decoy packets to send before the version packet. */
        unsigned num_ignore_version = m_rng.randrange(10);
        /** What data to send in the version packet (ignored by BIP324 peers, but reserved for future extensions). */
        auto ver_data = m_rng.randbytes<uint8_t>(m_rng.randbool() ? 0 : m_rng.randrange(1000));
        /** Whether to immediately send key and garbage out (required for responders, optional otherwise). */
        bool send_immediately = !initiator || m_rng.randbool();
        /** How many decoy packets to send before the first and second real message. */
        unsigned num_decoys_1 = m_rng.randrange(1000), num_decoys_2 = m_rng.randrange(1000);
        V2TransportTester tester(m_rng, initiator);
        if (send_immediately) {
            tester.SendKey();
            tester.SendGarbage(garb_len);
        }
        auto ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        if (!send_immediately) {
            tester.SendKey();
            tester.SendGarbage(garb_len);
        }
        tester.ReceiveKey();
        tester.SendGarbageTerm();
        for (unsigned v = 0; v < num_ignore_version; ++v) {
            size_t ver_ign_data_len = m_rng.randbool() ? 0 : m_rng.randrange(1000);
            auto ver_ign_data = m_rng.randbytes<uint8_t>(ver_ign_data_len);
            tester.SendVersion(ver_ign_data, true);
        }
        tester.SendVersion(ver_data, false);
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.ReceiveGarbage();
        tester.ReceiveVersion();
        tester.CompareSessionIDs();
        for (unsigned d = 0; d < num_decoys_1; ++d) {
            auto decoy_data = m_rng.randbytes<uint8_t>(m_rng.randrange(1000));
            tester.SendPacket(/*content=*/decoy_data, /*aad=*/{}, /*ignore=*/true);
        }
        auto msg_data_1 = m_rng.randbytes<uint8_t>(m_rng.randrange(4000000));
        tester.SendMessage(uint8_t(28), msg_data_1);
        for (unsigned d = 0; d < num_decoys_2; ++d) {
            auto decoy_data = m_rng.randbytes<uint8_t>(m_rng.randrange(1000));
            tester.SendPacket(/*content=*/decoy_data, /*aad=*/{}, /*ignore=*/true);
        }
        auto msg_data_2 = m_rng.randbytes<uint8_t>(m_rng.randrange(1000));
        tester.SendMessage(uint8_t(13), msg_data_2); // headers short id
        // Send invalidly-encoded message
        tester.SendMessage(std::string("blocktxn\x00\x00\x00a", CMessageHeader::COMMAND_SIZE), {});
        tester.SendMessage("foobar", {}); // test receiving unknown message type
        tester.AddMessage("barfoo", {}); // test sending unknown message type
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->size() == 4);
        BOOST_CHECK((*ret)[0] && (*ret)[0]->m_type == "addrv2" && std::ranges::equal((*ret)[0]->m_recv, MakeByteSpan(msg_data_1)));
        BOOST_CHECK((*ret)[1] && (*ret)[1]->m_type == "headers" && std::ranges::equal((*ret)[1]->m_recv, MakeByteSpan(msg_data_2)));
        BOOST_CHECK(!(*ret)[2]);
        BOOST_CHECK((*ret)[3] && (*ret)[3]->m_type == "foobar" && (*ret)[3]->m_recv.empty());
        tester.ReceiveMessage("barfoo", {});
    }

    // Too long garbage (initiator).
    {
        V2TransportTester tester(m_rng, true);
        auto ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.SendKey();
        tester.SendGarbage(V2Transport::MAX_GARBAGE_LEN + 1);
        tester.ReceiveKey();
        tester.SendGarbageTerm();
        ret = tester.Interact();
        BOOST_CHECK(!ret);
    }

    // Too long garbage (responder).
    {
        V2TransportTester tester(m_rng, false);
        tester.SendKey();
        tester.SendGarbage(V2Transport::MAX_GARBAGE_LEN + 1);
        auto ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.ReceiveKey();
        tester.SendGarbageTerm();
        ret = tester.Interact();
        BOOST_CHECK(!ret);
    }

    // Send garbage that includes the first 15 garbage terminator bytes somewhere.
    {
        V2TransportTester tester(m_rng, true);
        auto ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.SendKey();
        tester.ReceiveKey();
        /** The number of random garbage bytes before the included first 15 bytes of terminator. */
        size_t len_before = m_rng.randrange(V2Transport::MAX_GARBAGE_LEN - 16 + 1);
        /** The number of random garbage bytes after it. */
        size_t len_after = m_rng.randrange(V2Transport::MAX_GARBAGE_LEN - 16 - len_before + 1);
        // Construct len_before + 16 + len_after random bytes.
        auto garbage = m_rng.randbytes<uint8_t>(len_before + 16 + len_after);
        // Replace the designed 16 bytes in the middle with the to-be-sent garbage terminator.
        auto garb_term = MakeUCharSpan(tester.GetCipher().GetSendGarbageTerminator());
        std::copy(garb_term.begin(), garb_term.begin() + 16, garbage.begin() + len_before);
        // Introduce a bit error in the last byte of that copied garbage terminator, making only
        // the first 15 of them match.
        garbage[len_before + 15] ^= (uint8_t(1) << m_rng.randrange(8));
        tester.SendGarbage(garbage);
        tester.SendGarbageTerm();
        tester.SendVersion();
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->empty());
        tester.ReceiveGarbage();
        tester.ReceiveVersion();
        tester.CompareSessionIDs();
        auto msg_data_1 = m_rng.randbytes<uint8_t>(4000000); // test that receiving 4M payload works
        auto msg_data_2 = m_rng.randbytes<uint8_t>(4000000); // test that sending 4M payload works
        tester.SendMessage(uint8_t(m_rng.randrange(223) + 33), {}); // unknown short id
        tester.SendMessage(uint8_t(2), msg_data_1); // "block" short id
        tester.AddMessage("blocktxn", msg_data_2); // schedule blocktxn to be sent to us
        ret = tester.Interact();
        BOOST_REQUIRE(ret && ret->size() == 2);
        BOOST_CHECK(!(*ret)[0]);
        BOOST_CHECK((*ret)[1] && (*ret)[1]->m_type == "block" && std::ranges::equal((*ret)[1]->m_recv, MakeByteSpan(msg_data_1)));
        tester.ReceiveMessage(uint8_t(3), msg_data_2); // "blocktxn" short id
    }

    // Send correct network's V1 header
    {
        V2TransportTester tester(m_rng, false);
        tester.SendV1Version(Params().MessageStart());
        auto ret = tester.Interact();
        BOOST_CHECK(ret);
    }

    // Send wrong network's V1 header
    {
        V2TransportTester tester(m_rng, false);
        tester.SendV1Version(CChainParams::Main()->MessageStart());
        auto ret = tester.Interact();
        BOOST_CHECK(!ret);
    }
}